

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPla.c
# Opt level: O2

int Io_ReadPlaSelfSubsumption(word **pCs,int nCubes,int nWords,Vec_Bit_t *vMarks)

{
  ulong *puVar1;
  word *pIn1;
  word *pIn2;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  int Entry;
  int Entry_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  int local_80;
  
  Vec_BitFill(vMarks,nCubes,nWords);
  uVar16 = 0;
  uVar3 = 0;
  if (0 < nWords) {
    uVar3 = (ulong)(uint)nWords;
  }
  uVar4 = 0;
  if (0 < nCubes) {
    uVar4 = (ulong)(uint)nCubes;
  }
  uVar11 = 0xffffffffffffffff;
  local_80 = 0;
  do {
    if (uVar16 == uVar4) {
      return local_80;
    }
    iVar2 = Vec_BitEntry(vMarks,(int)uVar16);
    uVar14 = uVar16;
    if (iVar2 == 0) {
LAB_002dc6ce:
      do {
        do {
          iVar2 = (int)uVar14 + 1;
          if (nCubes <= iVar2) goto LAB_002dc6bc;
          iVar2 = Vec_BitEntry(vMarks,iVar2);
          uVar14 = uVar14 + 1;
        } while (iVar2 != 0);
        pIn1 = pCs[uVar16];
        pIn2 = pCs[uVar14];
        iVar2 = 0;
        bVar17 = false;
        for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
          if (pIn1[uVar6] != pIn2[uVar6]) {
            if (bVar17) goto LAB_002dc6ce;
            uVar8 = pIn2[uVar6] ^ pIn1[uVar6];
            uVar8 = uVar8 >> 1 & uVar8;
            uVar9 = uVar8 & 0x5555555555555555;
            if ((uVar9 ^ uVar9 - 1) <= uVar9 - 1) goto LAB_002dc6ce;
            bVar17 = (uVar8 & 0x55555555) == 0;
            uVar11 = uVar9 >> 0x20;
            if (!bVar17) {
              uVar11 = uVar9;
            }
            iVar13 = (uint)bVar17 * 0x20;
            iVar7 = iVar13 + 0x10;
            uVar8 = uVar11 >> 0x10;
            if ((uVar11 & 0x5555) != 0) {
              iVar7 = iVar13;
              uVar8 = uVar11;
            }
            iVar13 = iVar7 + 8;
            uVar11 = uVar8 >> 8;
            if ((uVar8 & 0x55) != 0) {
              iVar13 = iVar7;
              uVar11 = uVar8;
            }
            iVar7 = iVar13 + 4;
            uVar8 = uVar11 >> 4;
            if ((uVar11 & 0xf) != 0) {
              iVar7 = iVar13;
              uVar8 = uVar11;
            }
            uVar15 = (uint)(uVar8 >> 2) & 0x3fffffff;
            iVar13 = iVar7 + 2;
            if ((uVar8 & 3) != 0) {
              uVar15 = (uint)uVar8;
              iVar13 = iVar7;
            }
            uVar11 = (ulong)(((~uVar15 & 1) + iVar13 >> 1) + iVar2);
            bVar17 = true;
          }
          iVar2 = iVar2 + 0x20;
        }
      } while (!bVar17);
      if (((int)uVar11 < 0) || (nWords << 5 <= (int)uVar11)) {
        __assert_fail("iVar >= 0 && iVar < nWords*32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadPla.c"
                      ,0xbd,"int Io_ReadPlaSelfSubsumption(word **, int, int, Vec_Bit_t *)");
      }
      uVar8 = uVar11 >> 5 & 0x7ffffff;
      uVar9 = (ulong)(uint)((int)uVar8 << 3);
      bVar5 = (char)uVar11 * '\x02';
      uVar6 = *(ulong *)((long)pIn2 + uVar9);
      uVar10 = (ulong)((uint)(*(ulong *)((long)pIn1 + uVar9) >> (bVar5 & 0x3f)) & 3) <<
               (bVar5 & 0x3f);
      *(ulong *)((long)pIn1 + uVar9) = *(ulong *)((long)pIn1 + uVar9) ^ uVar10;
      uVar12 = (ulong)((uint)(uVar6 >> (bVar5 & 0x3f)) & 3) << (bVar5 & 0x3f);
      uVar6 = *(ulong *)((long)pIn2 + uVar9);
      *(ulong *)((long)pIn2 + uVar9) = uVar12 ^ uVar6;
      iVar2 = Abc_TtImply(pIn1,pIn2,nWords);
      if (iVar2 == 0) {
        iVar2 = Abc_TtImply(pIn2,pIn1,nWords);
        if (iVar2 == 0) {
          uVar14 = (ulong)(uint)((int)uVar8 * 8);
          puVar1 = (ulong *)((long)pIn1 + uVar14);
          *puVar1 = *puVar1 ^ uVar10;
          puVar1 = (ulong *)((long)pIn2 + uVar14);
          *puVar1 = *puVar1 ^ uVar12;
        }
        else {
          pIn2[uVar8] = uVar6;
          Vec_BitWriteEntry(vMarks,(int)uVar16,Entry_00);
          local_80 = local_80 + 1;
        }
      }
      else {
        pIn1[uVar8] = pIn1[uVar8] ^ uVar10;
        Vec_BitWriteEntry(vMarks,(int)uVar14,Entry);
        local_80 = local_80 + 1;
      }
    }
LAB_002dc6bc:
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

int Io_ReadPlaSelfSubsumption( word ** pCs, int nCubes, int nWords, Vec_Bit_t * vMarks )
{
    int c1, c2, Res, Counter = 0, iVar = -1, Val0, Val1;
    Vec_BitFill( vMarks, nCubes, 0 );
    for ( c1 = 0; c1 < nCubes; c1++ )
        if ( !Vec_BitEntry(vMarks, c1) )
            for ( c2 = c1 + 1; c2 < nCubes; c2++ )
                if ( !Vec_BitEntry(vMarks, c2) )
                {
                    Res = Io_ReadPlaConsensus( pCs[c1], pCs[c2], nWords, &iVar );
                    if ( !Res )
                        continue;
                    assert( iVar >= 0  && iVar < nWords*32 );
                    Val0 = Abc_TtGetQua( pCs[c1], iVar );
                    Val1 = Abc_TtGetQua( pCs[c2], iVar );
                    // remove values
                    Abc_TtXorQua( pCs[c1], iVar, Val0 );
                    Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    // check containment
                    if ( Abc_TtImply(pCs[c1], pCs[c2], nWords) )
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Vec_BitWriteEntry( vMarks, c2, 1 );
                        Counter++;
                    }
                    else if ( Abc_TtImply(pCs[c2], pCs[c1], nWords) )
                    {
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                        Vec_BitWriteEntry( vMarks, c1, 1 );
                        Counter++;
                        break;
                    }
                    else
                    {
                        Abc_TtXorQua( pCs[c1], iVar, Val0 );
                        Abc_TtXorQua( pCs[c2], iVar, Val1 );
                    }

/*
                    printf( "Var = %3d  ", iVar );
                    printf( "Cube0 = %d  ", Abc_TtGetQua(pCs[c1], iVar) );
                    printf( "Cube1 = %d  ", Abc_TtGetQua(pCs[c2], iVar) );
                    printf( "\n" );
                    Io_ReadPlaPrintCube( pCs[c1], 32 * nWords );
                    Io_ReadPlaPrintCube( pCs[c2], 32 * nWords );
                    printf( "\n" );
*/
                    break;
                }
    return Counter;
}